

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quadrilateral.h
# Opt level: O2

Quadrilateral<ZXing::PointT<double>_> * __thiscall
ZXing::RotatedCorners<ZXing::PointT<double>>
          (Quadrilateral<ZXing::PointT<double>_> *__return_storage_ptr__,ZXing *this,
          Quadrilateral<ZXing::PointT<double>_> *q,int n,bool mirror)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  size_t __n;
  size_t __n_00;
  PointT<double> __tmp;
  
  (__return_storage_ptr__->super_array<ZXing::PointT<double>,_4UL>)._M_elems[3].x = 0.0;
  (__return_storage_ptr__->super_array<ZXing::PointT<double>,_4UL>)._M_elems[3].y = 0.0;
  (__return_storage_ptr__->super_array<ZXing::PointT<double>,_4UL>)._M_elems[2].x = 0.0;
  (__return_storage_ptr__->super_array<ZXing::PointT<double>,_4UL>)._M_elems[2].y = 0.0;
  (__return_storage_ptr__->super_array<ZXing::PointT<double>,_4UL>)._M_elems[1].x = 0.0;
  (__return_storage_ptr__->super_array<ZXing::PointT<double>,_4UL>)._M_elems[1].y = 0.0;
  (__return_storage_ptr__->super_array<ZXing::PointT<double>,_4UL>)._M_elems[0].x = 0.0;
  (__return_storage_ptr__->super_array<ZXing::PointT<double>,_4UL>)._M_elems[0].y = 0.0;
  iVar4 = ((int)q + 4) % 4;
  __n_00 = (long)iVar4 * 0x10;
  __n = (long)iVar4 * -0x10 + 0x40;
  memcpy(__return_storage_ptr__,this + __n_00,__n);
  if (iVar4 != 0) {
    memcpy((void *)(__n + (long)__return_storage_ptr__),this,__n_00);
  }
  if ((char)n != '\0') {
    dVar1 = (__return_storage_ptr__->super_array<ZXing::PointT<double>,_4UL>)._M_elems[1].x;
    dVar2 = (__return_storage_ptr__->super_array<ZXing::PointT<double>,_4UL>)._M_elems[1].y;
    dVar3 = (__return_storage_ptr__->super_array<ZXing::PointT<double>,_4UL>)._M_elems[3].y;
    (__return_storage_ptr__->super_array<ZXing::PointT<double>,_4UL>)._M_elems[1].x =
         (__return_storage_ptr__->super_array<ZXing::PointT<double>,_4UL>)._M_elems[3].x;
    (__return_storage_ptr__->super_array<ZXing::PointT<double>,_4UL>)._M_elems[1].y = dVar3;
    (__return_storage_ptr__->super_array<ZXing::PointT<double>,_4UL>)._M_elems[3].x = dVar1;
    (__return_storage_ptr__->super_array<ZXing::PointT<double>,_4UL>)._M_elems[3].y = dVar2;
  }
  return __return_storage_ptr__;
}

Assistant:

Quadrilateral<PointT> RotatedCorners(const Quadrilateral<PointT>& q, int n = 1, bool mirror = false)
{
	Quadrilateral<PointT> res;
	std::rotate_copy(q.begin(), q.begin() + ((n + 4) % 4), q.end(), res.begin());
	if (mirror)
		std::swap(res[1], res[3]);
	return res;
}